

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall BooleanInstance::BooleanInstance(BooleanInstance *this,string *value)

{
  bool bVar1;
  string sVar2;
  undefined8 *puVar3;
  string *in_RDI;
  char *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  Instance *this_00;
  undefined1 local_31 [49];
  
  this_00 = (Instance *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"Boolean",(allocator *)this_00);
  Instance::Instance(this_00,in_RDI);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  *(undefined ***)in_RDI = &PTR__BooleanInstance_0020ed30;
  bVar1 = Grammar::is_boolean_value
                    ((string *)
                     CONCAT17(in_stack_ffffffffffffffa7,
                              CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  if (!bVar1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  sVar2 = (string)std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffa6,
                                                             in_stack_ffffffffffffffa0)),
                                  in_stack_ffffffffffffff98);
  in_RDI[0x58] = sVar2;
  return;
}

Assistant:

BooleanInstance::BooleanInstance(const std::string& value) : Instance("Boolean") {
    if (!Grammar::is_boolean_value(value))
        throw EXC_INVALID_ARGUMENT;
    _value = (value == "true");
}